

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

int ncnn::gemm_AT_BT_x86
              (Mat *AT,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int M,int N,int K,
              int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
              int nT,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Mat *in_RCX;
  void **in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppi;
  Mat topT;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  undefined1 in_stack_00001343;
  int in_stack_00001344;
  Mat *in_stack_00001348;
  Mat *in_stack_00001350;
  Mat *in_stack_00001358;
  Mat *in_stack_00001360;
  Mat *in_stack_00001368;
  undefined4 in_stack_fffffffffffff814;
  undefined4 in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff81c;
  int in_stack_fffffffffffff824;
  int in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  Mat *in_stack_fffffffffffff830;
  undefined8 in_stack_fffffffffffff870;
  void **ppvVar4;
  int in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  undefined8 in_stack_fffffffffffff880;
  int *in_stack_fffffffffffff890;
  int *in_stack_fffffffffffff898;
  int *in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a8;
  void **local_730;
  bool local_6c9;
  void *local_670;
  int *local_668;
  long local_660;
  undefined4 local_658;
  Mat *local_650;
  undefined4 local_648;
  int local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  long local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined4 local_610;
  long *local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined8 local_5e8;
  void *local_5e0;
  int *local_5d8;
  long local_5d0;
  undefined4 local_5c8;
  long *local_5c0;
  undefined4 local_5b8;
  int local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  long local_5a0;
  int local_594;
  int local_590;
  int local_58c;
  void **local_588;
  int local_57c;
  int local_578;
  int local_574;
  void *local_570;
  int *local_568;
  ulong local_560;
  undefined4 local_558;
  long *local_550;
  int local_548;
  int local_544;
  int local_540;
  undefined4 local_53c;
  undefined4 local_538;
  ulong local_530;
  void *local_528;
  int *local_520;
  ulong local_518;
  undefined4 local_510;
  long *local_508;
  int local_500;
  int local_4fc;
  int local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  ulong local_4e8;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined4 local_4d0;
  void *local_4c0;
  int *local_4b8;
  ulong local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  int local_498;
  int local_494;
  int local_490;
  undefined4 local_48c;
  int local_488;
  long local_480;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  int local_43c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  Mat *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff880 >> 0x20),(int)in_stack_fffffffffffff880,
             in_stack_fffffffffffff87c,in_stack_fffffffffffff878,
             (int)((ulong)in_stack_fffffffffffff870 >> 0x20),(int)in_stack_fffffffffffff870,
             in_stack_fffffffffffff890,in_stack_fffffffffffff898,in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff8a8);
  iVar1 = (in_R9D + in_stack_fffffffffffffb94 + -1) / in_stack_fffffffffffffb94;
  local_4c0 = (void *)0x0;
  local_4b8 = (int *)0x0;
  local_4b0 = 0;
  local_4a8 = 0;
  local_4a0 = (long *)0x0;
  local_498 = 0;
  local_494 = 0;
  local_490 = 0;
  local_48c = 0;
  local_488 = 0;
  local_480 = 0;
  if (((in_stack_fffffffffffffb8c < in_stack_00000010) || (in_R8D == 3)) || (in_stack_00000018 != 0)
     ) {
    Mat::create(in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff828,
                in_stack_fffffffffffff824,
                CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),
                (Allocator *)CONCAT44(in_stack_fffffffffffff814,in_stack_00000038));
    local_6c9 = local_4c0 == (void *)0x0 || local_480 * local_488 == 0;
    if (local_6c9) {
      local_43c = -100;
      goto LAB_01a4f283;
    }
  }
  for (local_4d4 = 0; local_4d4 < iVar1; local_4d4 = local_4d4 + 1) {
    local_4d8 = local_4d4 * in_stack_fffffffffffffb94;
    local_4e0 = in_R9D - local_4d8;
    piVar3 = std::min<int>(&local_4e0,(int *)&stack0xfffffffffffffb94);
    local_4dc = *piVar3;
    local_528 = (void *)0x0;
    local_520 = (int *)0x0;
    local_518 = 0;
    local_510 = 0;
    local_508 = (long *)0x0;
    local_500 = 0;
    local_4fc = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4e8 = 0;
    if (((in_stack_fffffffffffffb8c < in_stack_00000010) || (in_R8D == 3)) ||
       (in_stack_00000018 != 0)) {
      iVar2 = get_omp_thread_num();
      local_570 = (void *)((long)local_4c0 + local_480 * iVar2 * local_4b0);
      local_568 = (int *)0x0;
      local_560 = local_4b0;
      local_558 = local_4a8;
      local_550 = local_4a0;
      local_544 = local_494;
      local_540 = local_490;
      local_53c = 1;
      local_538 = local_48c;
      local_530 = ((long)local_494 * (long)local_490 * local_4b0 + 0xf & 0xfffffffffffffff0) /
                  local_4b0;
      local_548 = local_498 + -1;
      if (local_498 == 4) {
        local_530 = (long)local_494 * (long)local_490;
      }
      if (&local_528 != &local_570) {
        if (local_520 != (int *)0x0) {
          LOCK();
          iVar2 = *local_520;
          *local_520 = *local_520 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_508 == (long *)0x0) {
              if (local_528 != (void *)0x0) {
                free(local_528);
              }
            }
            else {
              (**(code **)(*local_508 + 0x18))(local_508,local_528);
            }
          }
        }
        local_528 = local_570;
        local_520 = local_568;
        local_518 = local_560;
        local_510 = local_558;
        local_508 = local_550;
        local_500 = local_548;
        local_4fc = local_544;
        local_4f8 = local_540;
        local_4f4 = local_53c;
        local_4f0 = local_538;
        local_4e8 = local_530;
      }
      if (local_568 != (int *)0x0) {
        LOCK();
        iVar2 = *local_568;
        *local_568 = *local_568 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_550 == (long *)0x0) {
            if (local_570 != (void *)0x0) {
              free(local_570);
            }
          }
          else {
            (**(code **)(*local_550 + 0x18))(local_550,local_570);
          }
        }
      }
      local_570 = (void *)0x0;
      local_560 = 0;
      local_558 = 0;
      local_548 = 0;
      local_544 = 0;
      local_540 = 0;
      local_53c = 0;
      local_538 = 0;
      local_530 = 0;
      local_568 = (int *)0x0;
    }
    for (local_574 = 0; local_574 < in_stack_00000008;
        local_574 = in_stack_fffffffffffffb90 + local_574) {
      local_57c = in_stack_00000008 - local_574;
      piVar3 = std::min<int>(&local_57c,(int *)&stack0xfffffffffffffb90);
      local_578 = *piVar3;
      if (in_R8D == 3) {
        pack_A_tile(in_RCX,(Mat *)CONCAT44(3,in_R9D),in_stack_fffffffffffffb94,
                    in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,iVar1);
      }
      local_730 = in_RDX;
      if (in_R8D == 3) {
        local_730 = &local_528;
      }
      local_588 = local_730;
      for (local_58c = 0; local_58c < in_stack_00000010;
          local_58c = in_stack_fffffffffffffb8c + local_58c) {
        local_594 = in_stack_00000010 - local_58c;
        piVar3 = std::min<int>(&local_594,(int *)&stack0xfffffffffffffb8c);
        local_590 = *piVar3;
        local_5b4 = *(int *)((long)in_RDI + 0x2c);
        local_5d0 = in_RDI[2];
        local_5c8 = (undefined4)in_RDI[3];
        local_608 = (long *)in_RDI[4];
        local_5e0 = (void *)(*in_RDI + in_RDI[8] * (long)(local_4d8 / in_stack_fffffffffffffb94) *
                                       in_RDI[2] +
                            (long)local_5b4 * (long)(local_58c / in_stack_fffffffffffffb8c) *
                            local_5d0);
        local_5a0 = (long)local_5b4;
        local_644 = *(int *)((long)in_RSI + 0x2c);
        local_660 = in_RSI[2];
        in_stack_fffffffffffffe9c = (undefined4)in_RSI[3];
        in_stack_fffffffffffffe90 = (Mat *)in_RSI[4];
        local_670 = (void *)(*in_RSI + in_RSI[8] * (long)(local_574 / in_stack_fffffffffffffb90) *
                                       in_RSI[2] +
                            (long)local_644 * (long)(local_58c / in_stack_fffffffffffffb8c) *
                            local_660);
        local_630 = (long)local_644;
        local_5a8 = 1;
        local_5ac = 1;
        local_5b0 = 1;
        local_5b8 = 2;
        local_5d8 = (int *)0x0;
        local_5f0 = 0;
        local_5f4 = 0;
        local_5f8 = 0;
        local_5fc = 0;
        local_610 = 0;
        local_618 = 0;
        local_620 = 0;
        local_628 = 0;
        local_638 = 1;
        local_63c = 1;
        local_640 = 1;
        local_648 = 2;
        local_668 = (int *)0x0;
        local_5e8 = 0;
        local_600 = 0;
        local_658 = in_stack_fffffffffffffe9c;
        local_650 = in_stack_fffffffffffffe90;
        local_5c0 = local_608;
        gemm_transB_packed_tile
                  (in_stack_00001368,in_stack_00001360,in_stack_00001358,in_stack_00001350,
                   in_stack_00001348,in_stack_00001344,local_4dc,local_574,local_578,local_58c,
                   local_590,
                   (uint)(in_stack_00000018 == 0 &&
                         in_stack_00000010 <= local_58c + in_stack_fffffffffffffb8c),
                   (bool)in_stack_00001343);
        ppvVar4 = &local_670;
        if (local_668 != (int *)0x0) {
          LOCK();
          iVar2 = *local_668;
          *local_668 = *local_668 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_650 == (Mat *)0x0) {
              if (local_670 != (void *)0x0) {
                free(local_670);
              }
            }
            else {
              (**(code **)((long)local_650->data + 0x18))(local_650,local_670);
            }
          }
        }
        *ppvVar4 = (void *)0x0;
        ppvVar4[2] = (void *)0x0;
        *(undefined4 *)(ppvVar4 + 3) = 0;
        *(undefined4 *)(ppvVar4 + 5) = 0;
        *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
        *(undefined4 *)(ppvVar4 + 6) = 0;
        *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
        *(undefined4 *)(ppvVar4 + 7) = 0;
        ppvVar4[8] = (void *)0x0;
        ppvVar4[1] = (void *)0x0;
        if (local_5d8 != (int *)0x0) {
          LOCK();
          iVar2 = *local_5d8;
          *local_5d8 = *local_5d8 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_5c0 == (long *)0x0) {
              if (local_5e0 != (void *)0x0) {
                free(local_5e0);
              }
            }
            else {
              (**(code **)(*local_5c0 + 0x18))(local_5c0,local_5e0);
            }
          }
        }
        local_5e0 = (void *)0x0;
        local_5d0 = 0;
        local_5c8 = 0;
        local_5b8 = 0;
        local_5b4 = 0;
        local_5b0 = 0;
        local_5ac = 0;
        local_5a8 = 0;
        local_5a0 = 0;
        local_5d8 = (int *)0x0;
      }
      if (in_stack_00000018 != 0) {
        transpose_unpack_output_tile
                  ((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (int)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                   in_stack_fffffffffffffe80);
      }
    }
    if (local_520 != (int *)0x0) {
      LOCK();
      iVar2 = *local_520;
      *local_520 = *local_520 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (local_508 == (long *)0x0) {
          if (local_528 != (void *)0x0) {
            free(local_528);
          }
        }
        else {
          (**(code **)(*local_508 + 0x18))(local_508,local_528);
        }
      }
    }
    local_528 = (void *)0x0;
    local_518 = 0;
    local_510 = 0;
    local_500 = 0;
    local_4fc = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4e8 = 0;
    local_520 = (int *)0x0;
  }
  local_43c = 0;
LAB_01a4f283:
  local_4d0 = 1;
  if (local_4b8 != (int *)0x0) {
    LOCK();
    iVar1 = *local_4b8;
    *local_4b8 = *local_4b8 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_4a0 == (long *)0x0) {
        if (local_4c0 != (void *)0x0) {
          free(local_4c0);
        }
      }
      else {
        (**(code **)(*local_4a0 + 0x18))(local_4a0,local_4c0);
      }
    }
  }
  return local_43c;
}

Assistant:

static int gemm_AT_BT_x86(const Mat& AT, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int N, int K, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}